

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O3

LispPTR N_OP_addbase(LispPTR base,LispPTR offset)

{
  uint uVar1;
  LispPTR LVar2;
  
  uVar1 = base & 0xfffffff;
  if ((offset & 0xfff0000) == 0xf0000) {
    LVar2 = uVar1 + (offset | 0xffff0000);
  }
  else if ((offset & 0xfff0000) == 0xe0000) {
    LVar2 = uVar1 + (offset & 0xffff);
  }
  else if ((*(ushort *)((ulong)(offset >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
    if ((offset & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)offset);
    }
    LVar2 = uVar1 + *(int *)(Lisp_world + offset);
  }
  else {
    MachineState.errorexit = 1;
    LVar2 = 0xffffffff;
    MachineState.tosvalue = offset;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_addbase(LispPTR base, LispPTR offset) {
  base = POINTERMASK & base;
  switch ((SEGMASK & offset)) {
    case S_POSITIVE: return (base + (offset & 0x0000FFFF));
    case S_NEGATIVE: return (base + (offset | 0xFFFF0000));
    default:
      switch ((GetTypeNumber(offset))) {
        case TYPE_FIXP:
          /* overflow or underflow isn't check */
          return (base + *(int *)NativeAligned4FromLAddr(offset));
        default: /* floatp also */ ERROR_EXIT(offset);
      } /* end switch */
  }     /* end switch */
}